

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intvars.cc
# Opt level: O2

flat_integer_variables_valuations_range_t *
tchecker::flat_integer_variables_valuations_range
          (flat_integer_variables_valuations_range_t *__return_storage_ptr__,
          flat_integer_variables_t *intvars)

{
  size_t sVar1;
  intvar_info_t *intvar_info;
  intvar_id_t id;
  ulong uVar2;
  flat_integer_variables_valuations_iterator_t it;
  intvar_values_range_t local_80;
  cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
  local_78;
  
  local_78._its.
  super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._its.
  super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._ends.
  super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._its.
  super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._ends.
  super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._ends.
  super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._begins.
  super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._begins.
  super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._nranges = 0;
  local_78._begins.
  super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uVar2 = 0;
  while( true ) {
    sVar1 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::size((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)intvars);
    if (sVar1 <= uVar2) break;
    intvar_info = variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::info((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)intvars,(uint)uVar2);
    local_80 = intvar_values_range(intvar_info);
    cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
    ::push_back(&local_78,&local_80);
    uVar2 = (ulong)((uint)uVar2 + 1);
  }
  cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
  ::cartesian_iterator_t(&__return_storage_ptr__->_begin,&local_78);
  cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
  ::~cartesian_iterator_t(&local_78);
  return __return_storage_ptr__;
}

Assistant:

tchecker::flat_integer_variables_valuations_range_t
flat_integer_variables_valuations_range(tchecker::flat_integer_variables_t const & intvars)
{
  tchecker::flat_integer_variables_valuations_iterator_t it;
  for (tchecker::intvar_id_t id = 0; id < intvars.size(); ++id)
    it.push_back(tchecker::intvar_values_range(intvars.info(id)));
  return tchecker::make_range(it, tchecker::past_the_end_iterator);
}